

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18.data_ = (this->m_in).data_;
  local_18.size_ = (this->m_in).size_;
  uVar1 = this->m_pos;
  uVar2 = uVar1;
  if (uVar1 < local_18.size_) {
    do {
      if (((int)local_18.data_[uVar1] - 0x3aU < 0xfffffff6) &&
         ((uVar3 = (byte)local_18.data_[uVar1] - 0x2b, uVar2 = uVar1, 0x3a < uVar3 ||
          ((0x40000000400000dU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) break;
      uVar1 = uVar1 + 1;
      this->m_pos = uVar1;
      uVar2 = local_18.size_;
    } while (local_18.size_ != uVar1);
  }
  uVar1 = this->m_tok_start;
  if (local_18.size_ < this->m_tok_start) {
    uVar1 = local_18.size_;
  }
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  if (local_18.size_ <= uVar2) {
    uVar2 = local_18.size_;
  }
  bVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_18,uVar1,uVar2 - uVar1);
  __return_storage_ptr__->kind = Number;
  (__return_storage_ptr__->text).data_ = bVar4.data_;
  (__return_storage_ptr__->text).size_ = bVar4.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			// be very permissive in lexer (we'll catch errors when conversion happens)
			if (!std::isdigit(ch) && ch != '.' && ch != 'e' && ch != 'E' && ch != '+' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Number);
	}